

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O0

void __thiscall
QDirListingPrivate::checkAndPushDirectory(QDirListingPrivate *this,QDirEntryInfo *entryInfo)

{
  QStringView fileName;
  bool bVar1;
  byte bVar2;
  IteratorFlags *this_00;
  QDirListingPrivate *in_RDI;
  long in_FS_OFFSET;
  bool includeHidden;
  IteratorFlag in_stack_ffffffffffffff6c;
  QDirEntryInfo *in_stack_ffffffffffffff70;
  QDirEntryInfo *this_01;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  IteratorFlags *this_02;
  QDirListingPrivate *entryInfo_00;
  undefined1 local_38 [44];
  QFlagsStorage<QDirListing::IteratorFlag> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = &in_RDI->iteratorFlags;
  entryInfo_00 = in_RDI;
  QFlags<QDirListing::IteratorFlag>::QFlags
            ((QFlags<QDirListing::IteratorFlag> *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff6c);
  bVar1 = QFlags<QDirListing::IteratorFlag>::testAnyFlags
                    (this_02,(QFlags<QDirListing::IteratorFlag>)local_c.i);
  if (bVar1) {
    this_00 = &in_RDI->iteratorFlags;
    QFlags<QDirListing::IteratorFlag>::QFlags
              ((QFlags<QDirListing::IteratorFlag> *)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c);
    bVar1 = QFlags<QDirListing::IteratorFlag>::testAnyFlags
                      (this_00,(QFlags<QDirListing::IteratorFlag>)local_38._40_4_);
    if ((bVar1) || (bVar1 = QDirEntryInfo::isSymLink(in_stack_ffffffffffffff70), !bVar1)) {
      this_01 = (QDirEntryInfo *)local_38;
      QDirEntryInfo::fileName(this_01);
      QStringView::QStringView<QString,_true>
                ((QStringView *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 (QString *)this_01);
      fileName.m_data = (storage_type_conflict *)this_02;
      fileName.m_size = (qsizetype)in_RDI;
      bVar2 = isDotOrDotDot(fileName);
      QString::~QString((QString *)0x2943a8);
      if (((bVar2 & 1) == 0) &&
         (((bVar1 = checkAndPushDirectory::anon_class_8_1_8991fb9c::operator()
                              ((anon_class_8_1_8991fb9c *)in_RDI), bVar1 ||
           (bVar1 = QDirEntryInfo::isHidden(in_stack_ffffffffffffff70), !bVar1)) &&
          (bVar1 = QDirEntryInfo::isDir(in_stack_ffffffffffffff70), bVar1)))) {
        pushDirectory(in_RDI,(QDirEntryInfo *)entryInfo_00);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDirListingPrivate::checkAndPushDirectory(QDirEntryInfo &entryInfo)
{
    using F = QDirListing::IteratorFlag;
    // If we're doing flat iteration, we're done.
    if (!iteratorFlags.testAnyFlags(F::Recursive))
        return;

    // Follow symlinks only when asked
    if (!iteratorFlags.testAnyFlags(F::FollowDirSymlinks) && entryInfo.isSymLink())
        return;

    // Never follow . and ..
    if (isDotOrDotDot(entryInfo.fileName()))
        return;

    // No hidden directories unless requested
    const bool includeHidden = [this]() {
        if (useLegacyFilters)
            return legacyDirFilters.testAnyFlags(QDir::AllDirs | QDir::Hidden);
        return iteratorFlags.testAnyFlags(QDirListing::IteratorFlag::IncludeHidden);
    }();
    if (!includeHidden && entryInfo.isHidden())
        return;

    // Never follow non-directory entries
    if (!entryInfo.isDir())
        return;

    pushDirectory(entryInfo);
}